

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddress::setAddress(QHostAddress *this,quint32 ip4Addr)

{
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(&this->d);
  QHostAddressPrivate::setAddress((this->d).d.ptr,ip4Addr);
  return;
}

Assistant:

void QHostAddress::setAddress(quint32 ip4Addr)
{
    d.detach();
    d->setAddress(ip4Addr);
}